

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int Internal_FakeWindowsLogfontName::CompareFamilyAndPostscriptNameHash
              (Internal_FakeWindowsLogfontName *lhs,Internal_FakeWindowsLogfontName *rhs)

{
  Internal_FakeWindowsLogfontName *rhs_local;
  Internal_FakeWindowsLogfontName *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (Internal_FakeWindowsLogfontName *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (Internal_FakeWindowsLogfontName *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ =
         ON_SHA1_Hash::Compare
                   (&lhs->m_family_and_postcript_name_hash,&rhs->m_family_and_postcript_name_hash);
  }
  return lhs_local._4_4_;
}

Assistant:

static int CompareFamilyAndPostscriptNameHash(
    const Internal_FakeWindowsLogfontName* lhs,
    const Internal_FakeWindowsLogfontName* rhs
    )
  {
    if (lhs == rhs)
      return 0;
    // nulls sort last
    if (nullptr == lhs)
      return 1;
    if (nullptr == rhs)
      return -1;
    return ON_SHA1_Hash::Compare(lhs->m_family_and_postcript_name_hash, rhs->m_family_and_postcript_name_hash);
  }